

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_queue_examples.cpp
# Opt level: O0

void density_tests::conc_heterogeneous_queue_put_transaction_samples(void)

{
  void **ppvVar1;
  bool bVar2;
  int *piVar3;
  ostream *poVar4;
  runtime_type<> *prVar5;
  type_info *ptVar6;
  char *pcVar7;
  double *pdVar8;
  bool local_769;
  double local_750;
  reentrant_put_transaction<double> local_748;
  undefined1 local_728 [8];
  reentrant_put_transaction<double> typed_put;
  reentrant_put_transaction<void> local_700;
  undefined1 local_6e0 [8];
  reentrant_put_transaction<void> untyped_put;
  undefined1 local_6b8 [4];
  int value_2;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_11;
  put_transaction<int> local_678;
  undefined1 local_650 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_10;
  put_transaction<void> local_610;
  undefined1 local_5e8 [8];
  put_transaction<void> put_3;
  undefined1 local_5b8 [4];
  int value_1;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_9;
  put_transaction<int> local_578;
  undefined1 local_550 [8];
  put_transaction<int> put_1;
  put_transaction<void> local_520;
  undefined1 local_4f8 [8];
  put_transaction<void> put_2;
  undefined1 local_4c8 [4];
  int value;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_8;
  int local_46c;
  put_transaction<int> local_468;
  int local_43c;
  put_transaction<int> local_438;
  undefined1 local_410 [8];
  put_transaction<int> put;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_7;
  put_transaction<int> local_3a8;
  undefined1 local_380 [8];
  put_transaction<void> transaction_2;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_6;
  put_transaction<int> local_318;
  undefined1 local_2f0 [8];
  put_transaction<void> transaction_1;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_5;
  anon_class_8_1_a8890831 post_message_2;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_4;
  anon_class_8_1_a8890831 post_message_1;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_3;
  int msg_2;
  int msg_1;
  anon_class_16_2_e5d92710 consume_all_msgs;
  time_point start_time;
  anon_class_8_1_a8890831 post_message;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_2;
  put_transaction<void> transaction2_1;
  put_transaction<int> local_180;
  undefined1 local_158 [8];
  put_transaction<int> transaction1_1;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_1;
  type transaction2;
  int local_bc;
  put_transaction<int> local_b8;
  undefined1 local_90 [8];
  put_transaction<int> transaction1;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  put_transaction<void> transaction;
  
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::put_transaction((put_transaction<void> *)&queue.m_queue.m_tail);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          put_transaction<void>::empty((put_transaction<void> *)&queue.m_queue.m_tail);
  if (!bVar2) {
    __assert_fail("transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x83,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)&queue.m_queue.m_tail);
  ppvVar1 = &transaction1.m_put_transaction.m_put_data.m_user_storage;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)ppvVar1);
  local_bc = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>(&local_b8,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)ppvVar1,&local_bc);
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<int>::put_transaction<int,void>((put_transaction<int> *)local_90,&local_b8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction(&local_b8);
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<int>::put_transaction<int,void>
            ((put_transaction<int> *)&queue_1.m_queue.m_tail,(put_transaction<int> *)local_90);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          put_transaction<int>::empty((put_transaction<int> *)local_90);
  if (!bVar2) {
    __assert_fail("transaction1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x9d,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  piVar3 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           put_transaction<int>::element<int,_nullptr>
                     ((put_transaction<int> *)&queue_1.m_queue.m_tail);
  if (*piVar3 != 1) {
    __assert_fail("transaction2.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x9e,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::commit((put_transaction<int> *)&queue_1.m_queue.m_tail);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          put_transaction<int>::empty((put_transaction<int> *)&queue_1.m_queue.m_tail);
  if (!bVar2) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0xa2,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)&queue_1.m_queue.m_tail);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_90);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&transaction1.m_put_transaction.m_put_data.m_user_storage);
  ppvVar1 = &transaction1_1.m_put_transaction.m_put_data.m_user_storage;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)ppvVar1);
  transaction2_1.m_put_transaction.m_put_data.m_user_storage._4_4_ = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>(&local_180,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)ppvVar1,
                  (int *)((long)&transaction2_1.m_put_transaction.m_put_data.m_user_storage + 4));
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<int>::put_transaction<int,void>((put_transaction<int> *)local_158,&local_180);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction(&local_180);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::put_transaction((put_transaction<void> *)&queue_2.m_queue.m_tail);
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<void>::operator=
            ((put_transaction<void> *)&queue_2.m_queue.m_tail,(put_transaction<int> *)local_158);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          put_transaction<int>::empty((put_transaction<int> *)local_158);
  if (!bVar2) {
    __assert_fail("transaction1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0xcc,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::commit((put_transaction<void> *)&queue_2.m_queue.m_tail);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          put_transaction<void>::empty((put_transaction<void> *)&queue_2.m_queue.m_tail);
  if (!bVar2) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0xce,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)&queue_2.m_queue.m_tail);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_158);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&transaction1_1.m_put_transaction.m_put_data.m_user_storage);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&post_message);
  start_time.__d.__r = (duration)(duration)&post_message;
  consume_all_msgs.start_time = (time_point *)std::chrono::_V2::system_clock::now();
  consume_all_msgs.queue =
       (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &consume_all_msgs.start_time;
  queue_3.m_queue.m_tail._4_4_ = 0x2a;
  queue_3.m_queue.m_tail._0_4_ = 0x237;
  _msg_2 = (rep)&post_message;
  conc_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&start_time,(void *)((long)&queue_3.m_queue.m_tail + 4),4);
  conc_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&start_time,&queue_3.m_queue.m_tail,4);
  conc_heterogeneous_queue_put_transaction_samples::anon_class_16_2_e5d92710::operator()
            ((anon_class_16_2_e5d92710 *)&msg_2);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&post_message);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&post_message_1);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&post_message_1);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&post_message_2);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&post_message_2);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&transaction_1.m_put_transaction.m_put_data.m_user_storage);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::put_transaction((put_transaction<void> *)local_2f0);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          put_transaction<void>::empty((put_transaction<void> *)local_2f0);
  if (!bVar2) {
    __assert_fail("transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x142,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  queue_6.m_queue.m_tail._4_4_ = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>(&local_318,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&transaction_1.m_put_transaction.m_put_data.m_user_storage,
                  (int *)((long)&queue_6.m_queue.m_tail + 4));
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<void>::operator=((put_transaction<void> *)local_2f0,&local_318);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction(&local_318);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          put_transaction<void>::empty((put_transaction<void> *)local_2f0);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x145,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_2f0);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&transaction_1.m_put_transaction.m_put_data.m_user_storage);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&transaction_2.m_put_transaction.m_put_data.m_user_storage);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::put_transaction((put_transaction<void> *)local_380);
  bVar2 = density::conc_heter_queue::put_transaction::operator_cast_to_bool
                    ((put_transaction *)local_380);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x14c,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  queue_7.m_queue.m_tail._4_4_ = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>(&local_3a8,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&transaction_2.m_put_transaction.m_put_data.m_user_storage,
                  (int *)((long)&queue_7.m_queue.m_tail + 4));
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<void>::operator=((put_transaction<void> *)local_380,&local_3a8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction(&local_3a8);
  bVar2 = density::conc_heter_queue::put_transaction::operator_cast_to_bool
                    ((put_transaction *)local_380);
  if (!bVar2) {
    __assert_fail("transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x14f,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_380);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&transaction_2.m_put_transaction.m_put_data.m_user_storage);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&put.m_put_transaction.m_put_data.m_user_storage);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&put.m_put_transaction.m_put_data.m_user_storage);
  if (!bVar2) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x157,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  local_43c = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>(&local_438,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&put.m_put_transaction.m_put_data.m_user_storage,&local_43c);
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<int>::put_transaction<int,void>((put_transaction<int> *)local_410,&local_438);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction(&local_438);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          put_transaction<int>::empty((put_transaction<int> *)local_410);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x15b,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::cancel((put_transaction<int> *)local_410);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&put.m_put_transaction.m_put_data.m_user_storage);
  local_769 = false;
  if (bVar2) {
    local_769 = density::
                conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                ::put_transaction<int>::empty((put_transaction<int> *)local_410);
  }
  if (local_769 == false) {
    __assert_fail("queue.empty() && put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x15d,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  local_46c = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>(&local_468,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&put.m_put_transaction.m_put_data.m_user_storage,&local_46c);
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<int>::operator=((put_transaction<int> *)local_410,&local_468);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction(&local_468);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::commit((put_transaction<int> *)local_410);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((consume_operation *)&queue_8.m_queue.m_tail,
                    (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&put.m_put_transaction.m_put_data.m_user_storage);
  piVar3 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           consume_operation::element<int>((consume_operation *)&queue_8.m_queue.m_tail);
  if (*piVar3 != 0x2a) {
    __assert_fail("queue.try_start_consume().element<int>() == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x162,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&queue_8.m_queue.m_tail);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_410);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&put.m_put_transaction.m_put_data.m_user_storage);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_4c8);
  put_2.m_put_transaction.m_put_data.m_user_storage._4_4_ = 0x2a;
  put_1.m_put_transaction.m_put_data.m_user_storage = (void *)density::runtime_type<>::make<int>();
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_dyn_push_copy(&local_520,
                      (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_4c8,
                      (runtime_type *)&put_1.m_put_transaction.m_put_data.m_user_storage,
                      (void *)((long)&put_2.m_put_transaction.m_put_data.m_user_storage + 4));
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<void>::put_transaction<void,void>((put_transaction<void> *)local_4f8,&local_520);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction(&local_520);
  piVar3 = (int *)density::
                  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                  ::put_transaction<void>::element_ptr((put_transaction<void> *)local_4f8);
  if (*piVar3 != 0x2a) {
    __assert_fail("*static_cast<int *>(put.element_ptr()) == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x16a,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Putting an ");
  prVar5 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           put_transaction<void>::complete_type((put_transaction<void> *)local_4f8);
  ptVar6 = density::runtime_type<>::type_info(prVar5);
  pcVar7 = std::type_info::name(ptVar6);
  poVar4 = std::operator<<(poVar4,pcVar7);
  poVar4 = std::operator<<(poVar4,"...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::commit((put_transaction<void> *)local_4f8);
  queue_9.m_queue.m_tail._4_4_ = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>(&local_578,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_4c8,(int *)((long)&queue_9.m_queue.m_tail + 4));
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<int>::put_transaction<int,void>((put_transaction<int> *)local_550,&local_578);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction(&local_578);
  piVar3 = (int *)density::
                  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                  ::put_transaction<int>::element_ptr((put_transaction<int> *)local_550);
  if (*piVar3 != 1) {
    __assert_fail("*static_cast<int *>(put_1.element_ptr()) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x172,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  piVar3 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           put_transaction<int>::element<int,_nullptr>((put_transaction<int> *)local_550);
  if (*piVar3 != 1) {
    __assert_fail("put_1.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x173,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::commit((put_transaction<int> *)local_550);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_550);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_4f8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_4c8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_5b8);
  put_3.m_put_transaction.m_put_data.m_user_storage._4_4_ = 0x2a;
  queue_10.m_queue.m_tail = (ControlBlock *)density::runtime_type<>::make<int>();
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_dyn_push_copy(&local_610,
                      (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_5b8,(runtime_type *)&queue_10.m_queue.m_tail,
                      (void *)((long)&put_3.m_put_transaction.m_put_data.m_user_storage + 4));
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<void>::put_transaction<void,void>((put_transaction<void> *)local_5e8,&local_610);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction(&local_610);
  prVar5 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           put_transaction<void>::complete_type((put_transaction<void> *)local_5e8);
  bVar2 = density::runtime_type<>::is<int>(prVar5);
  if (!bVar2) {
    __assert_fail("put.complete_type().is<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x17c,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Putting an ");
  prVar5 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           put_transaction<void>::complete_type((put_transaction<void> *)local_5e8);
  ptVar6 = density::runtime_type<>::type_info(prVar5);
  pcVar7 = std::type_info::name(ptVar6);
  poVar4 = std::operator<<(poVar4,pcVar7);
  poVar4 = std::operator<<(poVar4,"...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_5e8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_5b8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_650);
  queue_11.m_queue.m_tail._4_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>(&local_678,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_650,(int *)((long)&queue_11.m_queue.m_tail + 4));
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction(&local_678);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_650);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_6b8);
  untyped_put.m_put_transaction.m_put_data.m_user_storage._4_4_ = 0x2a;
  typed_put.m_put_transaction.m_put_data.m_user_storage =
       (void *)density::runtime_type<>::make<int>();
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_dyn_push_copy
            (&local_700,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_6b8,(runtime_type *)&typed_put.m_put_transaction.m_put_data.m_user_storage,
             (void *)((long)&untyped_put.m_put_transaction.m_put_data.m_user_storage + 4));
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
            ((reentrant_put_transaction<void> *)local_6e0,&local_700);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction(&local_700);
  local_750 = 42.0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<double>
            (&local_748,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_6b8,&local_750);
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<double>::reentrant_put_transaction<double,void>
            ((reentrant_put_transaction<double> *)local_728,&local_748);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<double>::~reentrant_put_transaction(&local_748);
  pdVar8 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           reentrant_put_transaction<double>::element<double,_nullptr>
                     ((reentrant_put_transaction<double> *)local_728);
  if ((*pdVar8 == 42.0) && (!NAN(*pdVar8))) {
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<double>::~reentrant_put_transaction
              ((reentrant_put_transaction<double> *)local_728);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)local_6e0);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_6b8);
    return;
  }
  __assert_fail("typed_put.element() == 42.",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                ,0x195,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
}

Assistant:

void conc_heterogeneous_queue_put_transaction_samples()
    {
        using namespace density;
        {
            //! [conc_heter_queue put_transaction default_construct example 1]
            conc_heter_queue<>::put_transaction<> transaction;
            assert(transaction.empty());
            //! [conc_heter_queue put_transaction default_construct example 1]
        }
        {
            //! [conc_heter_queue put_transaction copy_construct example 1]
            static_assert(
              !std::is_copy_constructible<conc_heter_queue<>::put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_constructible<conc_heter_queue<int>::put_transaction<>>::value, "");
            //! [conc_heter_queue put_transaction copy_construct example 1]
        }
        {
            //! [conc_heter_queue put_transaction copy_assign example 1]
            static_assert(
              !std::is_copy_assignable<conc_heter_queue<>::put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_assignable<conc_heter_queue<int>::put_transaction<>>::value, "");
            //! [conc_heter_queue put_transaction copy_assign example 1]
        }
        {
            //! [conc_heter_queue put_transaction move_construct example 1]
            conc_heter_queue<> queue;
            auto               transaction1 = queue.start_push(1);

            // move from transaction1 to transaction2
            auto transaction2(std::move(transaction1));
            assert(transaction1.empty());
            assert(transaction2.element() == 1);

            // commit transaction2
            transaction2.commit();
            assert(transaction2.empty());

            //! [conc_heter_queue put_transaction move_construct example 1]

            //! [conc_heter_queue put_transaction move_construct example 2]
            // put_transaction<void> can be move constructed from any put_transaction<T>
            static_assert(
              std::is_constructible<
                conc_heter_queue<>::put_transaction<void>,
                conc_heter_queue<>::put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                conc_heter_queue<>::put_transaction<void>,
                conc_heter_queue<>::put_transaction<int> &&>::value,
              "");

            // put_transaction<T> can be move constructed only from put_transaction<T>
            static_assert(
              !std::is_constructible<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_constructible<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<int> &&>::value,
              "");
            //! [conc_heter_queue put_transaction move_construct example 2]
        }
        {
            //! [conc_heter_queue put_transaction move_assign example 1]
            conc_heter_queue<> queue;
            auto               transaction1 = queue.start_push(1);

            conc_heter_queue<>::put_transaction<> transaction2;
            transaction2 = std::move(transaction1);
            assert(transaction1.empty());
            transaction2.commit();
            assert(transaction2.empty());
            //! [conc_heter_queue put_transaction move_assign example 1]

            //! [conc_heter_queue put_transaction move_assign example 2]
            // put_transaction<void> can be move assigned from any put_transaction<T>
            static_assert(
              std::is_assignable<
                conc_heter_queue<>::put_transaction<void>,
                conc_heter_queue<>::put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                conc_heter_queue<>::put_transaction<void>,
                conc_heter_queue<>::put_transaction<int> &&>::value,
              "");

            // put_transaction<T> can be move assigned only from put_transaction<T>
            static_assert(
              !std::is_assignable<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_assignable<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<int> &&>::value,
              "");
            //! [conc_heter_queue put_transaction move_assign example 2]
        }
        {
            //! [conc_heter_queue put_transaction raw_allocate example 1]
            conc_heter_queue<> queue;
            struct Msg
            {
                std::chrono::high_resolution_clock::time_point m_time =
                  std::chrono::high_resolution_clock::now();
                size_t m_len  = 0;
                void * m_data = nullptr;
            };

            auto post_message = [&queue](const void * i_data, size_t i_len) {
                auto transaction             = queue.start_emplace<Msg>();
                transaction.element().m_len  = i_len;
                transaction.element().m_data = transaction.raw_allocate(i_len, 1);
                memcpy(transaction.element().m_data, i_data, i_len);

                assert(
                  !transaction
                     .empty()); // a put transaction is not empty if it's bound to an element being put
                transaction.commit();
                assert(transaction.empty()); // the commit makes the transaction empty
            };

            auto const start_time = std::chrono::high_resolution_clock::now();

            auto consume_all_msgs = [&queue, &start_time] {
                while (auto consume = queue.try_start_consume())
                {
                    auto const checksum =
                      compute_checksum(consume.element<Msg>().m_data, consume.element<Msg>().m_len);
                    std::cout << "Message with checksum " << checksum << " at ";
                    std::cout << (consume.element<Msg>().m_time - start_time).count() << std::endl;
                    consume.commit();
                }
            };

            int msg_1 = 42, msg_2 = 567;
            post_message(&msg_1, sizeof(msg_1));
            post_message(&msg_2, sizeof(msg_2));

            consume_all_msgs();
            //! [conc_heter_queue put_transaction raw_allocate example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction raw_allocate_copy example 1]
            struct Msg
            {
                size_t m_len   = 0;
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const char * i_data, size_t i_len) {
                auto transaction            = queue.start_emplace<Msg>();
                transaction.element().m_len = i_len;
                transaction.element().m_chars =
                  transaction.raw_allocate_copy(i_data, i_data + i_len);
                memcpy(transaction.element().m_chars, i_data, i_len);
                transaction.commit();
            };
            //! [conc_heter_queue put_transaction raw_allocate_copy example 1]
            (void)post_message;
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction raw_allocate_copy example 2]
            struct Msg
            {
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const std::string & i_string) {
                auto transaction              = queue.start_emplace<Msg>();
                transaction.element().m_chars = transaction.raw_allocate_copy(i_string);
                transaction.commit();
            };
            //! [conc_heter_queue put_transaction raw_allocate_copy example 2]
            (void)post_message;
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction empty example 1]
            conc_heter_queue<>::put_transaction<> transaction;
            assert(transaction.empty());

            transaction = queue.start_push(1);
            assert(!transaction.empty());
            //! [conc_heter_queue put_transaction empty example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction operator_bool example 1]
            conc_heter_queue<>::put_transaction<> transaction;
            assert(!transaction);

            transaction = queue.start_push(1);
            assert(transaction);
            //! [conc_heter_queue put_transaction operator_bool example 1]
        }
        {
            //! [conc_heter_queue put_transaction cancel example 1]
            conc_heter_queue<> queue;

            // start and cancel a put
            assert(queue.empty());
            auto put = queue.start_push(42);
            /* assert(queue.empty()); <- this assert would trigger an undefined behavior, because it would access
        the queue during a non-reentrant put transaction. */
            assert(!put.empty());
            put.cancel();
            assert(queue.empty() && put.empty());

            // start and commit a put
            put = queue.start_push(42);
            put.commit();
            assert(queue.try_start_consume().element<int>() == 42);
            //! [conc_heter_queue put_transaction cancel example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction element_ptr example 1]
            int  value = 42;
            auto put   = queue.start_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(*static_cast<int *>(put.element_ptr()) == 42);
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;
            put.commit();
            //! [conc_heter_queue put_transaction element_ptr example 1]

            //! [conc_heter_queue put_transaction element_ptr example 2]
            auto put_1 = queue.start_push(1);
            assert(*static_cast<int *>(put_1.element_ptr()) == 1); // this is fine
            assert(put_1.element() == 1);                          // this is better
            put_1.commit();
            //! [conc_heter_queue put_transaction element_ptr example 2]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction complete_type example 1]
            int  value = 42;
            auto put   = queue.start_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(put.complete_type().is<int>());
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;
            //! [conc_heter_queue put_transaction complete_type example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction destroy example 1]
            queue.start_push(42); /* this transaction is destroyed without being committed,
                            so it gets canceled automatically. */
            //! [conc_heter_queue put_transaction destroy example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue typed_put_transaction element example 1]

            int  value = 42;
            auto untyped_put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);

            auto typed_put = queue.start_reentrant_push(42.);

            /* typed_put = std::move(untyped_put); <- this would not compile: can't assign an untyped
        transaction to a typed transaction */

            assert(typed_put.element() == 42.);

            //! [conc_heter_queue typed_put_transaction element example 1]
        }
    }